

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

gravity_list_t * gravity_list_new(gravity_vm *vm,uint32_t n)

{
  void *pvVar1;
  gravity_list_t *list;
  uint32_t n_local;
  gravity_vm *vm_local;
  
  if (n < 0x400001) {
    vm_local = (gravity_vm *)gravity_calloc((gravity_vm *)0x0,1,0x48);
    vm_local->context = (gravity_hash_t *)gravity_class_list;
    *(char **)&vm_local->nccalls = (char *)0x0;
    *(gravity_class_t **)&vm_local->aborted = (gravity_class_t *)0x0;
    vm_local->maxrecursion = 0;
    *(char **)&vm_local->nccalls = *(char **)&vm_local->nccalls + (n + 8);
    pvVar1 = realloc((void *)vm_local->maxrecursion,(long)*(char **)&vm_local->nccalls << 4);
    vm_local->maxrecursion = (gravity_int_t)pvVar1;
    if (vm != (gravity_vm *)0x0) {
      gravity_vm_transfer(vm,(gravity_object_t *)vm_local);
    }
  }
  else {
    vm_local = (gravity_vm *)0x0;
  }
  return (gravity_list_t *)vm_local;
}

Assistant:

gravity_list_t *gravity_list_new (gravity_vm *vm, uint32_t n) {
    if (n > MAX_ALLOCATION) return NULL;

    gravity_list_t *list = (gravity_list_t *)mem_alloc(NULL, sizeof(gravity_list_t));

    list->isa = gravity_class_list;
    marray_init(list->array);
    marray_resize(gravity_value_t, list->array, n + MARRAY_DEFAULT_SIZE);

    if (vm) gravity_vm_transfer(vm, (gravity_object_t*) list);
    return list;
}